

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagSubifd(TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir)

{
  uint64_t uVar1;
  uint32_t *value;
  ushort local_52;
  uint32_t *puStack_50;
  uint16_t p;
  uint32_t *pb;
  uint64_t *pa;
  uint32_t *o;
  int n;
  uint64_t m;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if ((tif->tif_dir).td_nsubifd == 0) {
    tif_local._4_4_ = 1;
  }
  else if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else {
    uVar1 = tif->tif_dataoff;
    if ((tif->tif_flags & 0x80000) == 0) {
      value = (uint32_t *)_TIFFmallocExt(tif,(ulong)(tif->tif_dir).td_nsubifd << 2);
      if (value == (uint32_t *)0x0) {
        TIFFErrorExtR(tif,"TIFFWriteDirectoryTagSubifd","Out of memory");
        return 0;
      }
      puStack_50 = value;
      pb = (uint32_t *)(tif->tif_dir).td_subifd;
      for (local_52 = 0; local_52 < (tif->tif_dir).td_nsubifd; local_52 = local_52 + 1) {
        if (pb == (uint32_t *)0x0) {
          __assert_fail("pa != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                        ,0x871,"int TIFFWriteDirectoryTagSubifd(TIFF *, uint32_t *, TIFFDirEntry *)"
                       );
        }
        if (0xffffffff < *(ulong *)pb) {
          TIFFErrorExtR(tif,"TIFFWriteDirectoryTagSubifd","Illegal value for SubIFD tag");
          _TIFFfreeExt(tif,value);
          return 0;
        }
        *puStack_50 = (uint32_t)*(undefined8 *)pb;
        puStack_50 = puStack_50 + 1;
        pb = pb + 2;
      }
      o._4_4_ = TIFFWriteDirectoryTagCheckedIfdArray
                          (tif,ndir,dir,0x14a,(uint)(tif->tif_dir).td_nsubifd,value);
      _TIFFfreeExt(tif,value);
    }
    else {
      o._4_4_ = TIFFWriteDirectoryTagCheckedIfd8Array
                          (tif,ndir,dir,0x14a,(uint)(tif->tif_dir).td_nsubifd,
                           (tif->tif_dir).td_subifd);
    }
    if (o._4_4_ == 0) {
      tif_local._4_4_ = 0;
    }
    else {
      tif->tif_flags = tif->tif_flags | 0x2000;
      tif->tif_nsubifd = (tif->tif_dir).td_nsubifd;
      if ((tif->tif_dir).td_nsubifd == 1) {
        tif->tif_subifdoff = 0;
      }
      else {
        tif->tif_subifdoff = uVar1;
      }
      tif_local._4_4_ = 1;
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagSubifd(TIFF *tif, uint32_t *ndir,
                                       TIFFDirEntry *dir)
{
    static const char module[] = "TIFFWriteDirectoryTagSubifd";
    uint64_t m;
    int n;
    if (tif->tif_dir.td_nsubifd == 0)
        return (1);
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    m = tif->tif_dataoff;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        uint32_t *o;
        uint64_t *pa;
        uint32_t *pb;
        uint16_t p;
        o = _TIFFmallocExt(tif, tif->tif_dir.td_nsubifd * sizeof(uint32_t));
        if (o == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }
        pa = tif->tif_dir.td_subifd;
        pb = o;
        for (p = 0; p < tif->tif_dir.td_nsubifd; p++)
        {
            assert(pa != 0);

            /* Could happen if an classicTIFF has a SubIFD of type LONG8 (which
             * is illegal) */
            if (*pa > 0xFFFFFFFFUL)
            {
                TIFFErrorExtR(tif, module, "Illegal value for SubIFD tag");
                _TIFFfreeExt(tif, o);
                return (0);
            }
            *pb++ = (uint32_t)(*pa++);
        }
        n = TIFFWriteDirectoryTagCheckedIfdArray(tif, ndir, dir, TIFFTAG_SUBIFD,
                                                 tif->tif_dir.td_nsubifd, o);
        _TIFFfreeExt(tif, o);
    }
    else
        n = TIFFWriteDirectoryTagCheckedIfd8Array(
            tif, ndir, dir, TIFFTAG_SUBIFD, tif->tif_dir.td_nsubifd,
            tif->tif_dir.td_subifd);
    if (!n)
        return (0);
    /*
     * Total hack: if this directory includes a SubIFD
     * tag then force the next <n> directories to be
     * written as ``sub directories'' of this one.  This
     * is used to write things like thumbnails and
     * image masks that one wants to keep out of the
     * normal directory linkage access mechanism.
     */
    tif->tif_flags |= TIFF_INSUBIFD;
    tif->tif_nsubifd = tif->tif_dir.td_nsubifd;
    if (tif->tif_dir.td_nsubifd == 1)
        tif->tif_subifdoff = 0;
    else
        tif->tif_subifdoff = m;
    return (1);
}